

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O1

void __thiscall
Potassco::AspifOutput::rule
          (AspifOutput *this,Head_t ht,AtomSpan *head,Weight_t bound,WeightLitSpan *body)

{
  ostream *poVar1;
  
  std::ostream::_M_insert<unsigned_long>((ulong)this->os_);
  poVar1 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::operator<<((ostream *)poVar1,ht.val_);
  add(this,head);
  poVar1 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::operator<<((ostream *)poVar1,1);
  poVar1 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::operator<<((ostream *)poVar1,bound);
  add(this,body);
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\n",1);
  return;
}

Assistant:

void AspifOutput::rule(Head_t ht, const AtomSpan& head, Weight_t bound, const WeightLitSpan& body) {
	startDir(Directive_t::Rule).add(static_cast<int>(ht)).add(head)
		.add(static_cast<int>(Body_t::Sum)).add(static_cast<int>(bound)).add(body)
		.endDir();
}